

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O2

void __thiscall
cmCTestMemCheckHandler::TestOutputFileNames
          (cmCTestMemCheckHandler *this,int test,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  pointer pbVar1;
  pointer pbVar2;
  cmCTest *pcVar3;
  bool bVar4;
  ulong uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  ostream *poVar7;
  string ofile;
  string log;
  char *local_230 [4];
  string index;
  Glob g;
  ostringstream cmCTestLog_msg;
  
  std::__cxx11::to_string(&index,test);
  std::__cxx11::string::string((string *)&ofile,(string *)&this->MemoryTesterOutputFile);
  uVar5 = std::__cxx11::string::find((char *)&ofile,0x695bba);
  std::__cxx11::string::replace((ulong)&ofile,uVar5,(string *)0x2);
  if (this->LogWithPID == true) {
    std::__cxx11::string::append((char *)&ofile);
    cmsys::Glob::Glob(&g);
    cmsys::Glob::FindFiles(&g,&ofile,(GlobMessages *)0x0);
    pvVar6 = cmsys::Glob::GetFiles_abi_cxx11_(&g);
    pbVar1 = (pvVar6->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (pvVar6->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar1 == pbVar2) {
      std::operator+(&log,"Cannot find memory tester output file: ",&ofile);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&log);
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar3 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x57f,local_230[0],false);
      std::__cxx11::string::~string((string *)local_230);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      ofile._M_string_length = 0;
      *ofile._M_dataplus._M_p = '\0';
      std::__cxx11::string::~string((string *)&log);
    }
    else {
      pvVar6 = cmsys::Glob::GetFiles_abi_cxx11_(&g);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(files,pvVar6);
    }
    cmsys::Glob::~Glob(&g);
    if (pbVar1 != pbVar2) goto LAB_00478035;
  }
  else {
    bVar4 = cmsys::SystemTools::FileExists(&ofile);
    if (!bVar4) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&g,
                     "Cannot find memory tester output file: ",&ofile);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&g);
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar3 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x587,log._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&log);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      ofile._M_string_length = 0;
      *ofile._M_dataplus._M_p = '\0';
      std::__cxx11::string::~string((string *)&g);
    }
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files,&ofile);
LAB_00478035:
  std::__cxx11::string::~string((string *)&ofile);
  std::__cxx11::string::~string((string *)&index);
  return;
}

Assistant:

void cmCTestMemCheckHandler::TestOutputFileNames(
  int test, std::vector<std::string>& files)
{
  std::string index = std::to_string(test);
  std::string ofile = this->MemoryTesterOutputFile;
  std::string::size_type pos = ofile.find("??");
  ofile.replace(pos, 2, index);
  if (this->LogWithPID) {
    ofile += ".*";
    cmsys::Glob g;
    g.FindFiles(ofile);
    if (g.GetFiles().empty()) {
      std::string log = "Cannot find memory tester output file: " + ofile;
      cmCTestLog(this->CTest, WARNING, log << std::endl);
      ofile.clear();
    } else {
      files = g.GetFiles();
      return;
    }
  } else if (!cmSystemTools::FileExists(ofile)) {
    std::string log = "Cannot find memory tester output file: " + ofile;
    cmCTestLog(this->CTest, WARNING, log << std::endl);
    ofile.clear();
  }
  files.push_back(std::move(ofile));
}